

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_allocator.cpp
# Opt level: O2

void duckdb::TupleDataAllocator::RecomputeHeapPointers
               (Vector *old_heap_ptrs,SelectionVector *old_heap_sel,data_ptr_t *row_locations,
               Vector *new_heap_ptrs,idx_t offset,idx_t count,TupleDataLayout *layout,
               idx_t base_col_offset)

{
  PhysicalType PVar1;
  data_ptr_t pdVar2;
  value_type vVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  ulong uVar6;
  TupleDataLayout *layout_00;
  ulong uVar7;
  idx_t iVar8;
  ulong __n;
  idx_t iVar9;
  bool bVar10;
  ValidityBytes row_mask;
  SelectionVector new_heap_sel;
  UnifiedVectorFormat new_heap_data;
  
  pdVar2 = old_heap_ptrs->data;
  UnifiedVectorFormat::UnifiedVectorFormat(&new_heap_data);
  Vector::ToUnifiedFormat(new_heap_ptrs,count + offset,&new_heap_data);
  SelectionVector::SelectionVector(&new_heap_sel,new_heap_data.sel);
  __n = 0;
  do {
    if ((ulong)(((long)(layout->types).
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(layout->types).
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x18) <= __n) {
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&new_heap_sel.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      UnifiedVectorFormat::~UnifiedVectorFormat(&new_heap_data);
      return;
    }
    pvVar4 = vector<unsigned_long,_true>::get<true>(&layout->offsets,__n);
    pvVar5 = vector<duckdb::LogicalType,_true>::get<true>(&layout->types,__n);
    PVar1 = pvVar5->physical_type_;
    if (PVar1 == LIST) {
LAB_01947b76:
      iVar8 = offset;
      iVar9 = count;
      while (bVar10 = iVar9 != 0, iVar9 = iVar9 - 1, bVar10) {
        row_mask.validity_mask = row_locations[iVar8] + base_col_offset;
        row_mask.capacity =
             ((long)(layout->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(layout->types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18;
        row_mask.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        row_mask.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((1 << ((byte)__n & 7) & (uint)row_mask.validity_mask[__n >> 3]) != 0) {
          uVar6 = iVar8;
          if (old_heap_sel->sel_vector != (sel_t *)0x0) {
            uVar6 = (ulong)old_heap_sel->sel_vector[iVar8];
          }
          uVar7 = iVar8;
          if (new_heap_sel.sel_vector != (sel_t *)0x0) {
            uVar7 = (ulong)new_heap_sel.sel_vector[iVar8];
          }
          *(long *)(row_mask.validity_mask + *pvVar4) =
               (*(long *)(row_mask.validity_mask + *pvVar4) - *(long *)(pdVar2 + uVar6 * 8)) +
               *(long *)(new_heap_data.data + uVar7 * 8);
        }
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&row_mask.validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        iVar8 = iVar8 + 1;
      }
    }
    else if (PVar1 == STRUCT) {
      layout_00 = TupleDataLayout::GetStructLayout(layout,__n);
      if (layout_00->all_constant == false) {
        RecomputeHeapPointers
                  (old_heap_ptrs,old_heap_sel,row_locations,new_heap_ptrs,offset,count,layout_00,
                   *pvVar4 + base_col_offset);
      }
    }
    else {
      if (PVar1 == ARRAY) goto LAB_01947b76;
      if (PVar1 == VARCHAR) {
        iVar8 = count;
        iVar9 = offset;
        while (bVar10 = iVar8 != 0, iVar8 = iVar8 - 1, bVar10) {
          row_mask.validity_mask = row_locations[iVar9] + base_col_offset;
          row_mask.capacity =
               ((long)(layout->types).
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(layout->types).
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18;
          row_mask.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          row_mask.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if ((1 << ((byte)__n & 7) & (uint)row_mask.validity_mask[__n >> 3]) != 0) {
            uVar6 = iVar9;
            if (old_heap_sel->sel_vector != (sel_t *)0x0) {
              uVar6 = (ulong)old_heap_sel->sel_vector[iVar9];
            }
            uVar7 = iVar9;
            if (new_heap_sel.sel_vector != (sel_t *)0x0) {
              uVar7 = (ulong)new_heap_sel.sel_vector[iVar9];
            }
            vVar3 = *pvVar4;
            if (0xc < *(uint *)(row_mask.validity_mask + vVar3)) {
              *(long *)(row_mask.validity_mask + vVar3 + 8) =
                   (*(long *)(row_mask.validity_mask + vVar3 + 8) - *(long *)(pdVar2 + uVar6 * 8)) +
                   *(long *)(new_heap_data.data + uVar7 * 8);
            }
          }
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&row_mask.validity_data.internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          iVar9 = iVar9 + 1;
        }
      }
    }
    __n = __n + 1;
  } while( true );
}

Assistant:

void TupleDataAllocator::RecomputeHeapPointers(Vector &old_heap_ptrs, const SelectionVector &old_heap_sel,
                                               const data_ptr_t row_locations[], Vector &new_heap_ptrs,
                                               const idx_t offset, const idx_t count, const TupleDataLayout &layout,
                                               const idx_t base_col_offset) {
	const auto old_heap_locations = FlatVector::GetData<data_ptr_t>(old_heap_ptrs);

	UnifiedVectorFormat new_heap_data;
	new_heap_ptrs.ToUnifiedFormat(offset + count, new_heap_data);
	const auto new_heap_locations = UnifiedVectorFormat::GetData<data_ptr_t>(new_heap_data);
	const auto new_heap_sel = *new_heap_data.sel;

	for (idx_t col_idx = 0; col_idx < layout.ColumnCount(); col_idx++) {
		const auto &col_offset = layout.GetOffsets()[col_idx];

		// Precompute mask indexes
		idx_t entry_idx;
		idx_t idx_in_entry;
		ValidityBytes::GetEntryIndex(col_idx, entry_idx, idx_in_entry);

		const auto &type = layout.GetTypes()[col_idx];
		switch (type.InternalType()) {
		case PhysicalType::VARCHAR: {
			for (idx_t i = 0; i < count; i++) {
				const auto idx = offset + i;
				const auto &row_location = row_locations[idx] + base_col_offset;
				ValidityBytes row_mask(row_location, layout.ColumnCount());
				if (!row_mask.RowIsValid(row_mask.GetValidityEntryUnsafe(entry_idx), idx_in_entry)) {
					continue;
				}

				const auto &old_heap_ptr = old_heap_locations[old_heap_sel.get_index(idx)];
				const auto &new_heap_ptr = new_heap_locations[new_heap_sel.get_index(idx)];

				const auto string_location = row_location + col_offset;
				if (Load<uint32_t>(string_location) > string_t::INLINE_LENGTH) {
					const auto string_ptr_location = string_location + string_t::HEADER_SIZE;
					const auto string_ptr = Load<data_ptr_t>(string_ptr_location);
					const auto diff = string_ptr - old_heap_ptr;
					D_ASSERT(diff >= 0);
					Store<data_ptr_t>(new_heap_ptr + diff, string_ptr_location);
				}
			}
			VerifyStrings(layout, type.id(), row_locations, col_idx, base_col_offset, col_offset, offset, count);
			break;
		}
		case PhysicalType::LIST:
		case PhysicalType::ARRAY: {
			for (idx_t i = 0; i < count; i++) {
				const auto idx = offset + i;
				const auto &row_location = row_locations[idx] + base_col_offset;
				ValidityBytes row_mask(row_location, layout.ColumnCount());
				if (!row_mask.RowIsValid(row_mask.GetValidityEntryUnsafe(entry_idx), idx_in_entry)) {
					continue;
				}

				const auto &old_heap_ptr = old_heap_locations[old_heap_sel.get_index(idx)];
				const auto &new_heap_ptr = new_heap_locations[new_heap_sel.get_index(idx)];

				const auto &list_ptr_location = row_location + col_offset;
				const auto list_ptr = Load<data_ptr_t>(list_ptr_location);
				const auto diff = list_ptr - old_heap_ptr;
				D_ASSERT(diff >= 0);
				Store<data_ptr_t>(new_heap_ptr + diff, list_ptr_location);
			}
			break;
		}
		case PhysicalType::STRUCT: {
			const auto &struct_layout = layout.GetStructLayout(col_idx);
			if (!struct_layout.AllConstant()) {
				RecomputeHeapPointers(old_heap_ptrs, old_heap_sel, row_locations, new_heap_ptrs, offset, count,
				                      struct_layout, base_col_offset + col_offset);
			}
			break;
		}
		default:
			continue;
		}
	}
}